

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::RandomShaderCase::checkShaderLimits(RandomShaderCase *this,Shader *shader)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  long *plVar2;
  pointer ppSVar3;
  size_type *psVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  int numSupported;
  int numRequiredSamplers;
  int local_c8;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  local_c4 = 0;
  for (ppSVar3 = (shader->m_uniforms).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppSVar3 !=
      (shader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar3 = ppSVar3 + 1) {
    local_c4 = local_c4 +
               (uint)((((*ppSVar3)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D
                     );
  }
  if (0 < local_c4) {
    uVar5 = 0x8872;
    if (shader->m_type == TYPE_VERTEX) {
      uVar5 = 0x8b4c;
    }
    local_c8 = -1;
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(uVar5,&local_c8);
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_80._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
    if ((int)local_80._M_string_length != 0) {
      auVar6 = __cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)glu::getErrorName;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_c0,(de *)&local_80,auVar6._8_8_);
      std::operator+(&local_a0,"Limit query failed: ",&local_c0);
      tcu::TestError::TestError(auVar6._0_8_,&local_a0);
      __cxa_throw(auVar6._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (local_c8 < local_c4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_40,&local_c4);
      std::operator+(&local_80,"Shader requires ",&local_40);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_c0._M_dataplus._M_p = (pointer)*plVar2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_c0._M_dataplus._M_p == psVar4) {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0.field_2._8_8_ = plVar2[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar4;
      }
      local_c0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      de::toString<int>(&local_60,&local_c8);
      std::operator+(&local_a0,&local_c0,&local_60);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_a0);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkShaderLimits (const rsg::Shader& shader) const
{
	const int numRequiredSamplers = getNumSamplerUniforms(shader.getUniforms());

	if (numRequiredSamplers > 0)
	{
		const GLenum	pname			= (shader.getType() == rsg::Shader::TYPE_VERTEX) ? (GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS) : (GL_MAX_TEXTURE_IMAGE_UNITS);
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(pname, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredSamplers)
			throw tcu::NotSupportedError("Shader requires " + de::toString(numRequiredSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}